

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_0::MaybeRestartJavaMethod
               (Printer *printer,int *bytecode_estimate,int *method_num,char *chain_statement,
               char *method_decl)

{
  int iVar1;
  int i;
  string local_50;
  
  if (0x8000 < *bytecode_estimate) {
    iVar1 = *method_num;
    *method_num = iVar1 + 1U;
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)(iVar1 + 1U),(int)method_num);
    io::Printer::Print(printer,chain_statement,"method_num",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)(uint)*method_num,i);
    io::Printer::Print(printer,method_decl,"method_num",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    io::Printer::Indent(printer);
    *bytecode_estimate = 0;
  }
  return;
}

Assistant:

void MaybeRestartJavaMethod(io::Printer* printer,
                            int *bytecode_estimate,
                            int *method_num,
                            const char *chain_statement,
                            const char *method_decl) {
  // The goal here is to stay under 64K bytes of jvm bytecode/method,
  // since otherwise we hit a hardcoded limit in the jvm and javac will
  // then fail with the error "code too large". This limit lets our
  // estimates be off by a factor of two and still we're okay.
  static const int bytesPerMethod = kMaxStaticSize;

  if ((*bytecode_estimate) > bytesPerMethod) {
    ++(*method_num);
    printer->Print(chain_statement, "method_num", SimpleItoa(*method_num));
    printer->Outdent();
    printer->Print("}\n");
    printer->Print(method_decl, "method_num", SimpleItoa(*method_num));
    printer->Indent();
    *bytecode_estimate = 0;
  }
}